

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int compare_patches_internal
              (int me,double eps,int ndim,double *array1,int *lo1,int *hi1,int *dims1,double *array2
              ,int *lo2,int *hi2,int *dims2)

{
  int iVar1;
  int idx_1;
  int iVar2;
  int factor;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  long lVar7;
  int i;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int subscr2 [7];
  int subscr1 [7];
  char val [48];
  char msg [48];
  double *local_f8;
  double *local_f0;
  long local_e0;
  int local_d8 [8];
  int local_b8 [8];
  char local_98 [48];
  char local_68 [56];
  
  local_f0 = array2;
  uVar5 = (ulong)(uint)ndim;
  local_f8 = array1;
  if (0 < ndim) {
    uVar6 = 0;
    iVar3 = 1;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + lo1[uVar6] * iVar3;
      iVar3 = iVar3 * dims1[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    uVar6 = 0;
    iVar4 = 1;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + lo2[uVar6] * iVar4;
      iVar4 = iVar4 * dims2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    local_f8 = array1 + iVar1;
    local_f0 = array2 + iVar3;
    if (0 < ndim) {
      iVar1 = 1;
      uVar6 = 0;
      do {
        iVar4 = hi1[uVar6] - lo1[uVar6];
        iVar3 = lo2[uVar6];
        if (iVar4 != hi2[uVar6] - iVar3) {
          __assert_fail("diff == (hi2[i]-lo2[i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                        ,0xde,
                        "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                       );
        }
        if (dims1[uVar6] <= iVar4) {
          __assert_fail("diff < dims1[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                        ,0xdf,
                        "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                       );
        }
        if (dims2[uVar6] <= iVar4) {
          __assert_fail("diff < dims2[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                        ,0xe0,
                        "int compare_patches_internal(int, double, int, double *, int *, int *, int *, double *, int *, int *, int *)"
                       );
        }
        iVar1 = iVar1 * (iVar4 + 1);
        local_b8[uVar6] = lo1[uVar6];
        local_d8[uVar6] = iVar3;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      if (iVar1 < 1) {
        return 0;
      }
      goto LAB_00104299;
    }
  }
  iVar1 = 1;
LAB_00104299:
  lVar10 = 0;
  local_e0 = 0;
  iVar3 = 0;
  do {
    if (ndim < 1) {
      lVar9 = 0;
      lVar7 = 0;
    }
    else {
      uVar6 = 0;
      iVar4 = 1;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + local_b8[uVar6] * iVar4;
        iVar4 = iVar4 * dims1[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar6 = 0;
      iVar4 = 1;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + local_d8[uVar6] * iVar4;
        iVar4 = iVar4 * dims2[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      lVar9 = (long)iVar8;
      lVar7 = (long)iVar2;
    }
    if (iVar3 == 0) {
      lVar10 = lVar7;
      local_e0 = lVar9;
    }
    dVar11 = local_f8[lVar9 - local_e0];
    dVar12 = local_f0[lVar7 - lVar10];
    dVar14 = -dVar11;
    dVar13 = dVar14;
    if (dVar14 <= dVar11) {
      dVar13 = dVar11;
    }
    dVar15 = -dVar12;
    dVar16 = dVar15;
    if (dVar15 <= dVar12) {
      dVar16 = dVar12;
    }
    if (dVar16 <= dVar13) {
      dVar13 = dVar11;
      if (dVar11 < 0.0) {
        dVar13 = dVar14;
      }
    }
    else {
      dVar13 = dVar12;
      if (dVar12 < 0.0) {
        dVar13 = dVar15;
      }
    }
    dVar11 = dVar11 - dVar12;
    dVar12 = -dVar11;
    if (-dVar11 <= dVar11) {
      dVar12 = dVar11;
    }
    if (eps < dVar12 / (double)(-(ulong)(dVar13 == 0.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar13 == 0.0) &
                               (~-(ulong)(dVar13 < eps) & (ulong)dVar13 |
                               -(ulong)(dVar13 < eps) & 0x3ff0000000000000))) {
      sprintf(local_68,"ERROR (proc=%d): a",(ulong)(uint)me);
      sprintf(local_98,"=%f, ",local_f8[lVar9 - local_e0]);
      print_subscript(local_68,ndim,local_b8,local_98);
      sprintf(local_68,"=%f\n",local_f0[lVar7 - lVar10]);
      print_subscript(" b",ndim,local_d8,local_68);
      sleep(1);
      return 1;
    }
    if (0 < ndim) {
      uVar6 = 0;
      do {
        if (local_b8[uVar6] < hi1[uVar6]) {
          local_b8[uVar6] = local_b8[uVar6] + 1;
          break;
        }
        local_b8[uVar6] = lo1[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar6 = 0;
      do {
        if (local_d8[uVar6] < hi2[uVar6]) {
          local_d8[uVar6] = local_d8[uVar6] + 1;
          break;
        }
        local_d8[uVar6] = lo2[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == iVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int compare_patches_internal(int me, double eps, int ndim, double *array1, 
                     int lo1[], int hi1[], int dims1[],
             double *array2, int lo2[], int hi2[], 
                     int dims2[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM], subscr2[GA_MAX_DIM];
    double diff,max;
    double *patch1, *patch2;
    Integer idx1, idx2, offset1=0, offset2=0;

        /* compute pointer to first element in patch */ 
    patch1 = array1 +  Index(ndim, lo1, dims1);    
    patch2 = array2 +  Index(ndim, lo2, dims2);    

        /* count # of elements & verify consistency of both patches */
    for(i=0;i<ndim;i++){  
        Integer diff = hi1[i]-lo1[i];
        assert(diff == (hi2[i]-lo2[i]));
        assert(diff < dims1[i]);
        assert(diff < dims2[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
        subscr2[i]=lo2[i];
    }

    /* compare element values in both patches */ 
    for(j=0; j< elems; j++){ 
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    
        idx2 = Index(ndim, subscr2, dims2);

        if(j==0){
            offset1 =idx1;
            offset2 =idx2;
        }
        idx1 -= offset1;
        idx2 -= offset2;

                diff = patch1[idx1] - patch2[idx2];
                max  = GA_MAX(GA_ABS(patch1[idx1]),GA_ABS(patch2[idx2]));
                if(max == 0. || max <eps) max = 1.; 

        if(eps < GA_ABS(diff)/max){
            char msg[48], val[48];
            sprintf(msg,"ERROR (proc=%d): a",me);
            sprintf(val,"=%f, ",patch1[idx1]);
            print_subscript(msg,ndim,subscr1,val);
            sprintf(msg,"=%f\n",patch2[idx2]);
            print_subscript(" b",ndim,subscr2,msg);
                        sleep(1);
                        return(1);
        }

        { /* update subscript for the patches */
           update_subscript(ndim, subscr1, lo1,hi1, dims1);
           update_subscript(ndim, subscr2, lo2,hi2, dims2);
        }
    }

        return(0);
}